

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

bool ON_TransformPointGrid
               (int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
               int point_stride1,double *point,ON_Xform *xform)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = false;
  if (point_count0 < 1) {
    point_count0 = 0;
  }
  for (iVar3 = 0; point_count0 != iVar3; iVar3 = iVar3 + 1) {
    bVar1 = ON_TransformPointList(dim,is_rat,point_count1,point_stride1,point,xform);
    bVar2 = (bool)((iVar3 == 0 | bVar2) & bVar1);
    point = point + point_stride0;
  }
  return bVar2;
}

Assistant:

bool 
ON_TransformPointGrid(
                  int dim, bool is_rat, 
                  int point_count0, int point_count1,
                  int point_stride0, int point_stride1,
                  double* point,
                  const ON_Xform& xform
                  )
{
  bool rc = false;
  int i;
  double* pt = point;
  for ( i = 0; i < point_count0; i++ ) {
    if ( !ON_TransformPointList( dim, is_rat, point_count1, point_stride1, pt, xform ) ) {
      rc = false;
    }
    else if ( !i ) {
      rc = true;
    }
    pt += point_stride0;
  }
  return rc;
}